

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA256.cpp
# Opt level: O1

String * SHA256::hashFile(String *__return_storage_ptr__,Path *file,MapType type)

{
  MemoryMappedFile mmf;
  MemoryMappedFile local_50;
  
  MemoryMappedFile::MemoryMappedFile(&local_50,file,READ_ONLY,DONT_LOCK);
  if (local_50.mAccessType == NO_ACCESS) {
    (__return_storage_ptr__->mString)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mString).field_2;
    (__return_storage_ptr__->mString)._M_string_length = 0;
    (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
  }
  else {
    hash(__return_storage_ptr__,(char *)local_50.mpMapped,(uint)local_50.mFileSize,type);
  }
  MemoryMappedFile::~MemoryMappedFile(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String SHA256::hashFile(const Path& file, MapType type)
{
    MemoryMappedFile mmf(file);
    if(!mmf.isOpen()) return String();
    return hash(static_cast<const char*>(mmf.filePtr()), mmf.size(), type);
}